

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_bench.cc
# Opt level: O2

uint64_t __thiscall sfc64::operator()(sfc64 *this)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  uVar1 = this->m_b;
  uVar2 = this->m_c;
  uVar3 = this->m_counter;
  this->m_counter = uVar3 + 1;
  uVar3 = this->m_a + uVar1 + uVar3;
  this->m_a = uVar1 >> 0xb ^ uVar1;
  this->m_b = uVar2 * 9;
  this->m_c = (uVar2 << 0x18 | uVar2 >> 0x28) + uVar3;
  return uVar3;
}

Assistant:

uint64_t operator()() noexcept {
        auto const tmp = m_a + m_b + m_counter++;
        m_a = m_b ^ (m_b >> right_shift);
        m_b = m_c + (m_c << left_shift);
        m_c = rotl(m_c, rotation) + tmp;
        return tmp;
    }